

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsCell.cpp
# Opt level: O0

void __thiscall KDReports::Cell::Cell(Cell *this)

{
  CellPrivate *this_00;
  Cell *this_local;
  
  Element::Element(&this->super_Element);
  (this->super_Element)._vptr_Element = (_func_int **)&PTR__Cell_001c86e0;
  this_00 = (CellPrivate *)operator_new(0x48);
  CellPrivate::CellPrivate(this_00);
  std::unique_ptr<KDReports::CellPrivate,std::default_delete<KDReports::CellPrivate>>::
  unique_ptr<std::default_delete<KDReports::CellPrivate>,void>
            ((unique_ptr<KDReports::CellPrivate,std::default_delete<KDReports::CellPrivate>> *)
             &this->d,this_00);
  return;
}

Assistant:

KDReports::Cell::Cell()
    : d(new CellPrivate)
{
}